

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrtarga.c
# Opt level: O1

void start_output_tga(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo)

{
  int num_colors;
  FILE *__stream;
  jpeg_error_mgr *pjVar1;
  code *pcVar2;
  long lVar3;
  
  if (cinfo->out_color_space == JCS_RGB) {
    if (cinfo->quantize_colors == 0) {
      write_header(cinfo,dinfo,0);
      pcVar2 = put_pixel_rows;
      goto LAB_00106168;
    }
    num_colors = cinfo->actual_number_of_colors;
    if (0x100 < (long)num_colors) {
      pjVar1 = cinfo->err;
      pjVar1->msg_code = 0x413;
      (pjVar1->msg_parm).i[0] = num_colors;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    write_header(cinfo,dinfo,num_colors);
    if (0 < num_colors) {
      __stream = (FILE *)dinfo->output_file;
      lVar3 = 0;
      do {
        putc((uint)cinfo->colormap[2][lVar3],__stream);
        putc((uint)cinfo->colormap[1][lVar3],__stream);
        putc((uint)(*cinfo->colormap)[lVar3],__stream);
        lVar3 = lVar3 + 1;
      } while (num_colors != lVar3);
    }
  }
  else {
    if (cinfo->out_color_space != JCS_GRAYSCALE) {
      pjVar1 = cinfo->err;
      pjVar1->msg_code = 0x40e;
      (*pjVar1->error_exit)((j_common_ptr)cinfo);
      return;
    }
    write_header(cinfo,dinfo,0);
    if (cinfo->quantize_colors != 0) {
      pcVar2 = put_demapped_gray;
      goto LAB_00106168;
    }
  }
  pcVar2 = put_gray_rows;
LAB_00106168:
  dinfo->put_pixel_rows = pcVar2;
  return;
}

Assistant:

METHODDEF(void)
start_output_tga(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo)
{
  tga_dest_ptr dest = (tga_dest_ptr)dinfo;
  int num_colors, i;
  FILE *outfile;

  if (cinfo->out_color_space == JCS_GRAYSCALE) {
    /* Targa doesn't have a mapped grayscale format, so we will */
    /* demap quantized gray output.  Never emit a colormap. */
    write_header(cinfo, dinfo, 0);
    if (cinfo->quantize_colors)
      dest->pub.put_pixel_rows = put_demapped_gray;
    else
      dest->pub.put_pixel_rows = put_gray_rows;
  } else if (cinfo->out_color_space == JCS_RGB) {
    if (cinfo->quantize_colors) {
      /* We only support 8-bit colormap indexes, so only 256 colors */
      num_colors = cinfo->actual_number_of_colors;
      if (num_colors > 256)
        ERREXIT1(cinfo, JERR_TOO_MANY_COLORS, num_colors);
      write_header(cinfo, dinfo, num_colors);
      /* Write the colormap.  Note Targa uses BGR byte order */
      outfile = dest->pub.output_file;
      for (i = 0; i < num_colors; i++) {
        putc(cinfo->colormap[2][i], outfile);
        putc(cinfo->colormap[1][i], outfile);
        putc(cinfo->colormap[0][i], outfile);
      }
      dest->pub.put_pixel_rows = put_gray_rows;
    } else {
      write_header(cinfo, dinfo, 0);
      dest->pub.put_pixel_rows = put_pixel_rows;
    }
  } else {
    ERREXIT(cinfo, JERR_TGA_COLORSPACE);
  }
}